

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  _Var1;
  PODArray<int> a;
  PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> b;
  __uniq_ptr_impl<int,_re2::PODArray<int>::Deleter> _Stack_48;
  __uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
  local_38;
  
  DebugCheckInvariants(this);
  _Var1._M_head_impl.len_ = (Deleter)0;
  if ((this->dense_).ptr_._M_t.
      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
      .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>._M_head_impl
      != (IndexValue *)0x0) {
    _Var1._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  if ((int)_Var1._M_head_impl.len_ < new_max_size) {
    PODArray<int>::PODArray((PODArray<int> *)&_Stack_48,new_max_size);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::PODArray
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)&local_38,new_max_size)
    ;
    if (0 < (int)_Var1._M_head_impl.len_) {
      memmove(_Stack_48._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl,
              (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
              .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl,
              (ulong)(uint)_Var1._M_head_impl.len_ * 4);
      memmove(local_38._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl,
              (this->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl,(ulong)(uint)_Var1._M_head_impl.len_ << 4);
    }
    std::__uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>::operator=
              ((__uniq_ptr_impl<int,_re2::PODArray<int>::Deleter> *)&this->sparse_,&_Stack_48);
    std::
    __uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ::operator=((__uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                 *)&this->dense_,&local_38);
    std::
    unique_ptr<re2::SparseArray<re2::NFA::Thread_*>::IndexValue[],_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ::~unique_ptr((unique_ptr<re2::SparseArray<re2::NFA::Thread_*>::IndexValue[],_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                   *)&local_38);
    std::unique_ptr<int[],_re2::PODArray<int>::Deleter>::~unique_ptr
              ((unique_ptr<int[],_re2::PODArray<int>::Deleter> *)&_Stack_48);
  }
  if (new_max_size < this->size_) {
    this->size_ = new_max_size;
  }
  DebugCheckInvariants(this);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}